

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DCFGReader.cpp
# Opt level: O0

void __thiscall DCFGReader::loadCFGs(DCFGReader *this)

{
  bool bVar1;
  reference piVar2;
  reference ppCVar3;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar4;
  CFG *cfg;
  iterator __end1_1;
  iterator __begin1_1;
  set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *__range1_1;
  iterator iStack_a0;
  int entry;
  iterator __end1;
  iterator __begin1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1;
  string local_80 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  _Base_ptr local_48;
  undefined1 local_40;
  value_type_conflict1 local_24;
  undefined1 local_20 [8];
  json obj;
  DCFGReader *this_local;
  
  obj.m_value = (json_value)this;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_20,(nullptr_t)0x0);
  local_24 = 4;
  pVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert(&this->m_entries,&local_24);
  local_48 = (_Base_ptr)pVar4.first._M_node;
  local_40 = pVar4.second;
  nlohmann::operator>>
            ((istream *)&(this->super_CFGReader).m_input,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"FILE_NAMES",(allocator *)((long)&__range1 + 7));
  readStrings(&local_60,(json *)local_20,(string *)local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->m_filenames,&local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  readProcesses(this,(json *)local_20);
  __end1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&this->m_entries);
  iStack_a0 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->m_entries);
  while( true ) {
    bVar1 = std::operator!=(&__end1,&stack0xffffffffffffff60);
    if (!bVar1) break;
    piVar2 = std::_Rb_tree_const_iterator<int>::operator*(&__end1);
    buildCFG(this,*piVar2);
    std::_Rb_tree_const_iterator<int>::operator++(&__end1);
  }
  CFGReader::cfgs((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&__begin1_1,
                  &this->super_CFGReader);
  __end1_1 = std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::begin
                       ((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&__begin1_1);
  cfg = (CFG *)std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::end
                         ((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&__begin1_1);
  while( true ) {
    bVar1 = std::operator!=(&__end1_1,(_Self *)&cfg);
    if (!bVar1) break;
    ppCVar3 = std::_Rb_tree_const_iterator<CFG_*>::operator*(&__end1_1);
    CFG::check(*ppCVar3);
    std::_Rb_tree_const_iterator<CFG_*>::operator++(&__end1_1);
  }
  std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::~set
            ((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&__begin1_1);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_20);
  return;
}

Assistant:

void DCFGReader::loadCFGs() {
	json obj;

	// We consider the first block (4, the first id after the special ones)
	// as an CFG entry.
	m_entries.insert(4);

	m_input >> obj;

	m_filenames = readStrings(obj, "FILE_NAMES");
	readProcesses(obj);

	for (int entry : m_entries)
		this->buildCFG(entry);

	for (CFG* cfg : this->cfgs())
		cfg->check();
}